

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O3

ConstantValue * __thiscall
slang::ast::builtins::ArraySortMethod::eval
          (ConstantValue *__return_storage_ptr__,ArraySortMethod *this,EvalContext *context,
          Args *args,SourceRange param_3,SystemCallInfo *callInfo)

{
  SVQueue *pSVar1;
  variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *__v;
  Expression *pEVar2;
  ConstantValue *pCVar3;
  variant_alternative_t<8UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar4;
  variant_alternative_t<5UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar5;
  pair<const_slang::ast::Expression_*,_const_slang::ast::ValueSymbol_*> pVar6;
  ConstantValue *iterVal;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_EvalContext_h:113:13)>
  guard;
  LValue lval;
  undefined1 local_2d0 [8];
  undefined8 local_2c8 [3];
  _Map_pointer ppCStack_2b0;
  Expression *local_2a8;
  _Elt_pointer pCStack_2a0;
  EvalContext *local_298;
  _Map_pointer ppCStack_290;
  Expression *local_288;
  undefined1 *puStack_280;
  EvalContext *local_278;
  Expression *local_270;
  undefined1 *puStack_268;
  EvalContext *local_260;
  _Elt_pointer local_258;
  _Elt_pointer pCStack_250;
  _Elt_pointer local_248;
  _Map_pointer ppCStack_240;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_EvalContext_h:113:13)>
  local_238;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_220;
  _Elt_pointer local_1f8;
  _Elt_pointer pCStack_1f0;
  _Elt_pointer local_1e8;
  _Map_pointer ppCStack_1e0;
  undefined1 local_1d8 [32];
  _Variant_storage<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
  local_1b8;
  
  Expression::evalLValue((LValue *)&local_1b8,*args->_M_ptr,context);
  if (local_1b8._M_index != '\0') {
    __v = &LValue::resolve((LValue *)&local_1b8)->value;
    if (__v != (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                *)0x0) {
      pVar6 = CallExpression::SystemCallInfo::getIteratorInfo(callInfo);
      pEVar2 = pVar6.first;
      if (pEVar2 == (Expression *)0x0) {
        if ((__v->
            super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ).
            super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ._M_index == '\b') {
          pvVar4 = std::
                   get<8ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                             (__v);
          pSVar1 = pvVar4->ptr;
          if (this->reversed == true) {
            local_2c8[0] = (pSVar1->
                           super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>)
                           .
                           super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            local_2c8[1] = (pSVar1->
                           super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>)
                           .
                           super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_first;
            local_2c8[2] = (pSVar1->
                           super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>)
                           .
                           super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_last;
            ppCStack_2b0 = (pSVar1->
                           super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>)
                           .
                           super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_node;
            local_2a8 = (Expression *)
                        (pSVar1->
                        super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                        super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur;
            pCStack_2a0 = (pSVar1->
                          super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                          super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_first;
            local_298 = (EvalContext *)
                        (pSVar1->
                        super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                        super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_last;
            ppCStack_290 = (pSVar1->
                           super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>)
                           .
                           super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node;
            std::ranges::__sort_fn::
            operator()<std::reverse_iterator<std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>,_std::reverse_iterator<std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>,_std::less<void>,_std::identity>
                      (&local_258,(__sort_fn *)&std::ranges::sort,local_2c8);
          }
          else {
            std::ranges::__sort_fn::operator()<slang::SVQueue_&,_std::less<void>,_std::identity>
                      (&local_258,(__sort_fn *)&std::ranges::sort);
          }
        }
        else {
          pvVar5 = std::
                   get<5ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                             (__v);
          if (this->reversed == true) {
            local_2c8[0] = (pvVar5->
                           super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
            local_2a8 = (Expression *)
                        (pvVar5->
                        super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                        )._M_impl.super__Vector_impl_data._M_start;
            std::ranges::__sort_fn::
            operator()<std::reverse_iterator<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>_>,_std::reverse_iterator<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>_>,_std::less<void>,_std::identity>
                      ((__sort_fn *)&local_258,&std::ranges::sort);
          }
          else {
            std::ranges::__sort_fn::
            operator()<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,___gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::less<void>,_std::identity>
                      ((__sort_fn *)&std::ranges::sort,
                       (pvVar5->
                       super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                       )._M_impl.super__Vector_impl_data._M_start,
                       (pvVar5->
                       super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
          }
        }
      }
      else {
        EvalContext::disableCaching(&local_238,context);
        local_220._M_index = '\0';
        pCVar3 = EvalContext::createLocal(context,pVar6.second,(ConstantValue *)&local_220);
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage(&local_220);
        local_2d0 = (undefined1  [8])pCVar3;
        if ((__v->
            super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ).
            super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ._M_index == '\b') {
          pvVar4 = std::
                   get<8ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                             (__v);
          pSVar1 = pvVar4->ptr;
          if (this->reversed == true) {
            local_258 = (pSVar1->
                        super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                        super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            pCStack_250 = (pSVar1->
                          super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                          super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first;
            local_248 = (pSVar1->
                        super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                        super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_last;
            ppCStack_240 = (pSVar1->
                           super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>)
                           .
                           super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_node;
            local_1f8 = (pSVar1->
                        super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                        super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur;
            pCStack_1f0 = (pSVar1->
                          super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                          super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_first;
            local_1e8 = (pSVar1->
                        super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                        super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_last;
            ppCStack_1e0 = (pSVar1->
                           super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>)
                           .
                           super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node;
            puStack_280 = local_2d0;
            local_288 = pEVar2;
            local_278 = context;
            std::ranges::__sort_fn::
            operator()<std::reverse_iterator<std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>,_std::reverse_iterator<std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_builtins_ArrayMethods_cpp:168:29),_std::identity>
                      (local_2c8,(__sort_fn *)&std::ranges::sort);
          }
          else {
            puStack_268 = local_2d0;
            local_2c8[0] = (pSVar1->
                           super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>)
                           .
                           super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_2c8[1] = (pSVar1->
                           super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>)
                           .
                           super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_first;
            local_2c8[2] = (pSVar1->
                           super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>)
                           .
                           super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_last;
            ppCStack_2b0 = (pSVar1->
                           super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>)
                           .
                           super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node;
            local_2a8 = (Expression *)
                        (pSVar1->
                        super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                        super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            pCStack_2a0 = (pSVar1->
                          super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                          super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first;
            local_298 = (EvalContext *)
                        (pSVar1->
                        super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                        super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_last;
            ppCStack_290 = (pSVar1->
                           super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>)
                           .
                           super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_node;
            local_270 = pEVar2;
            local_260 = context;
            std::ranges::__sort_fn::
            operator()<std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>,_std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_builtins_ArrayMethods_cpp:168:29),_std::identity>
                      (local_1d8,(__sort_fn *)&std::ranges::sort);
          }
        }
        else {
          pvVar5 = std::
                   get<5ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                             (__v);
          if (this->reversed == true) {
            local_258 = (pvVar5->
                        super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
            local_1f8 = (pvVar5->
                        super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                        )._M_impl.super__Vector_impl_data._M_start;
            pCStack_2a0 = (_Elt_pointer)local_2d0;
            local_2a8 = pEVar2;
            local_298 = context;
            std::ranges::__sort_fn::
            operator()<std::reverse_iterator<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>_>,_std::reverse_iterator<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_builtins_ArrayMethods_cpp:168:29),_std::identity>
                      ((__sort_fn *)local_2c8,&std::ranges::sort);
          }
          else {
            local_2c8[1] = local_2d0;
            local_2c8[0] = pEVar2;
            local_2c8[2] = context;
            std::ranges::__sort_fn::
            operator()<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,___gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_builtins_ArrayMethods_cpp:168:29),_std::identity>
                      ((__sort_fn *)&std::ranges::sort,
                       (pvVar5->
                       super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                       )._M_impl.super__Vector_impl_data._M_start,
                       (pvVar5->
                       super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
          }
        }
        ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../include/slang/ast/EvalContext.h:113:13)>
        ::~ScopeGuard(&local_238);
      }
    }
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->value).
           super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
   + 0x20) = '\0';
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>::
  ~_Variant_storage(&local_1b8);
  return __return_storage_ptr__;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo& callInfo) const final {
        auto lval = args[0]->evalLValue(context);
        if (!lval)
            return nullptr;

        auto target = lval.resolve();
        if (!target)
            return nullptr;

        auto [iterExpr, iterVar] = callInfo.getIteratorInfo();
        if (iterExpr) {
            SLANG_ASSERT(iterVar);
            auto guard = context.disableCaching();
            auto iterVal = context.createLocal(iterVar);

            auto sortTarget = [&, ie = iterExpr](auto& target) {
                auto pred = [&, ie = ie](ConstantValue& a, ConstantValue& b) {
                    *iterVal = a;
                    ConstantValue cva = ie->eval(context);

                    *iterVal = b;
                    ConstantValue cvb = ie->eval(context);

                    return cva < cvb;
                };

                if (reversed)
                    std::ranges::sort(target.rbegin(), target.rend(), pred);
                else
                    std::ranges::sort(target, pred);
            };

            if (target->isQueue()) {
                sortTarget(*target->queue());
            }
            else {
                auto& vec = std::get<ConstantValue::Elements>(target->getVariant());
                sortTarget(vec);
            }
        }
        else {
            auto sortTarget = [&](auto& target) {
                if (reversed)
                    std::ranges::sort(target.rbegin(), target.rend(), std::less<>{});
                else
                    std::ranges::sort(target, std::less<>{});
            };

            if (target->isQueue()) {
                sortTarget(*target->queue());
            }
            else {
                auto& vec = std::get<ConstantValue::Elements>(target->getVariant());
                sortTarget(vec);
            }
        }

        return nullptr;
    }